

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

Vector2f __thiscall
sf::RenderTarget::mapPixelToCoords(RenderTarget *this,Vector2i *point,View *view)

{
  Transform *this_00;
  float fVar1;
  Vector2f VVar2;
  float fVar4;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  IntRect IVar6;
  Vector2f local_18;
  
  IVar6 = getViewport(this,view);
  fVar1 = (float)((*point).x - IVar6.left);
  fVar4 = (float)((*point).y - IVar6.top);
  auVar3._0_4_ = fVar1 + fVar1;
  auVar3._4_4_ = fVar4 + fVar4;
  auVar3._8_8_ = 0;
  auVar5._0_4_ = (float)IVar6.width;
  auVar5._4_4_ = (float)IVar6.height;
  auVar5._8_8_ = 0;
  auVar3 = divps(auVar3,auVar5);
  local_18.y = 1.0 - auVar3._4_4_;
  local_18.x = auVar3._0_4_ + -1.0;
  this_00 = View::getInverseTransform(view);
  VVar2 = Transform::transformPoint(this_00,&local_18);
  return VVar2;
}

Assistant:

Vector2f RenderTarget::mapPixelToCoords(const Vector2i& point, const View& view) const
{
    // First, convert from viewport coordinates to homogeneous coordinates
    Vector2f normalized;
    IntRect viewport = getViewport(view);
    normalized.x = -1.f + 2.f * (point.x - viewport.left) / viewport.width;
    normalized.y =  1.f - 2.f * (point.y - viewport.top)  / viewport.height;

    // Then transform by the inverse of the view matrix
    return view.getInverseTransform().transformPoint(normalized);
}